

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempseat.c
# Opt level: O3

void tempseat_set_busy_status(Seat *seat,BusyStatus status)

{
  (**(code **)((seat[-10].vt)->output + 0x58))();
  return;
}

Assistant:

static void tempseat_set_busy_status(Seat *seat, BusyStatus status)
{
    TempSeat *ts = container_of(seat, TempSeat, seat);
    /*
     * set_busy_status is generally called when something is about to
     * do some single-threaded, event-loop blocking computation. This
     * _shouldn't_ happen in a backend while it's waiting for a
     * network connection to be made, but if for some reason it were
     * to, there's no reason we can't just pass this straight to the
     * real seat, because we expect that it will mark itself busy,
     * compute, and mark itself unbusy, all between yields to the
     * event loop that might give whatever else is using the real Seat
     * an opportunity to do anything.
     */
    seat_set_busy_status(ts->realseat, status);
}